

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::reserve
          (SmallVector<std::function<void_()>,_0UL> *this,size_t count)

{
  undefined4 *puVar1;
  code *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  function<void_()> *pfVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  function<void_()> *pfVar11;
  long lVar12;
  ulong uVar13;
  
  if (count >> 0x3b == 0) {
    uVar13 = this->buffer_capacity;
    if (uVar13 < count) {
      uVar13 = uVar13 + (uVar13 == 0);
      do {
        uVar6 = uVar13;
        uVar13 = uVar6 * 2;
      } while (uVar6 < count);
      pfVar7 = (function<void_()> *)malloc(uVar6 << 5);
      if (pfVar7 == (function<void_()> *)0x0) goto LAB_002dd5aa;
      pfVar11 = (this->super_VectorView<std::function<void_()>_>).ptr;
      if ((pfVar7 != pfVar11) &&
         ((this->super_VectorView<std::function<void_()>_>).buffer_size != 0)) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          pfVar11 = (this->super_VectorView<std::function<void_()>_>).ptr;
          puVar9 = (undefined8 *)((long)&(pfVar7->super__Function_base)._M_functor + lVar12);
          *puVar9 = 0;
          puVar9[1] = 0;
          *(undefined8 *)((long)&(pfVar7->super__Function_base)._M_manager + lVar12) = 0;
          *(undefined8 *)((long)&pfVar7->_M_invoker + lVar12) =
               *(undefined8 *)((long)&pfVar11->_M_invoker + lVar12);
          if (*(long *)((long)&(pfVar11->super__Function_base)._M_manager + lVar12) != 0) {
            puVar1 = (undefined4 *)((long)&(pfVar7->super__Function_base)._M_functor + lVar12);
            puVar9 = (undefined8 *)((long)&(pfVar11->super__Function_base)._M_manager + lVar12);
            puVar8 = (undefined4 *)((long)&(pfVar11->super__Function_base)._M_functor + lVar12);
            uVar3 = puVar8[1];
            uVar4 = puVar8[2];
            uVar5 = puVar8[3];
            *puVar1 = *puVar8;
            puVar1[1] = uVar3;
            puVar1[2] = uVar4;
            puVar1[3] = uVar5;
            *(undefined8 *)((long)&(pfVar7->super__Function_base)._M_manager + lVar12) = *puVar9;
            *puVar9 = 0;
            *(undefined8 *)((long)&pfVar11->_M_invoker + lVar12) = 0;
            pfVar11 = (this->super_VectorView<std::function<void_()>_>).ptr;
            pcVar2 = *(code **)((long)&(pfVar11->super__Function_base)._M_manager + lVar12);
            if (pcVar2 != (code *)0x0) {
              lVar10 = (long)&(pfVar11->super__Function_base)._M_functor + lVar12;
              (*pcVar2)(lVar10,lVar10,3);
            }
          }
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar13 < (this->super_VectorView<std::function<void_()>_>).buffer_size);
        pfVar11 = (this->super_VectorView<std::function<void_()>_>).ptr;
      }
      if (pfVar11 != (function<void_()> *)0x0) {
        free(pfVar11);
      }
      (this->super_VectorView<std::function<void_()>_>).ptr = pfVar7;
      this->buffer_capacity = uVar6;
    }
    return;
  }
LAB_002dd5aa:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}